

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

int parse_der_signature(uchar *der,size_t len,mp_int *r,mp_int *s)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  
  uVar4 = 0;
  if ((*der & 0x3f) == 0x30) {
    pbVar8 = der + len;
    bVar1 = der[1];
    uVar3 = (ulong)(char)bVar1;
    pbVar6 = der + 2;
    if ((long)uVar3 < 0) {
      if ((bVar1 & 0x7f) == 0) {
        uVar3 = 0;
      }
      else {
        lVar5 = 0;
        uVar3 = 0;
        do {
          uVar3 = (ulong)pbVar6[lVar5] | uVar3 << 8;
          lVar5 = lVar5 + 1;
        } while (((int)(char)bVar1 & 0x7fU) != (uint)lVar5);
        pbVar6 = der + (ulong)((bVar1 & 0x7f) - 1) + 3;
      }
    }
    if (der + uVar3 + 1 <= pbVar8) {
      if ((*pbVar6 & 0x3f) == 2) {
        bVar1 = pbVar6[1];
        uVar3 = (ulong)(char)bVar1;
        pbVar7 = pbVar6 + 2;
        if ((long)uVar3 < 0) {
          if ((bVar1 & 0x7f) == 0) {
            uVar3 = 0;
          }
          else {
            lVar5 = 0;
            uVar3 = 0;
            do {
              uVar3 = (ulong)pbVar7[lVar5] | uVar3 << 8;
              lVar5 = lVar5 + 1;
            } while (((int)(char)bVar1 & 0x7fU) != (uint)lVar5);
            pbVar7 = pbVar6 + (ulong)((bVar1 & 0x7f) - 1) + 3;
          }
        }
        pbVar6 = pbVar7 + uVar3;
        if (pbVar8 < pbVar6) {
          return 0;
        }
        iVar2 = mp_read_unsigned_bin(r,pbVar7,(int)uVar3);
        if (iVar2 != 0) {
          return 0;
        }
      }
      uVar4 = 0;
      if ((*pbVar6 & 0x3f) == 2) {
        bVar1 = pbVar6[1];
        uVar3 = (ulong)(char)bVar1;
        pbVar7 = pbVar6 + 2;
        if ((long)uVar3 < 0) {
          if ((bVar1 & 0x7f) == 0) {
            uVar3 = 0;
          }
          else {
            lVar5 = 0;
            uVar3 = 0;
            do {
              uVar3 = (ulong)pbVar7[lVar5] | uVar3 << 8;
              lVar5 = lVar5 + 1;
            } while (((int)(char)bVar1 & 0x7fU) != (uint)lVar5);
            pbVar7 = pbVar6 + (ulong)((bVar1 & 0x7f) - 1) + 3;
          }
        }
        if (pbVar7 + uVar3 <= pbVar8) {
          iVar2 = mp_read_unsigned_bin(s,pbVar7,(int)uVar3);
          uVar4 = (uint)(iVar2 == 0);
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int parse_der_signature(const unsigned char* der, size_t len, mp_int* r, mp_int* s)
{
	const unsigned char* end = der + len;

	SEQUENCE
	{
		if ((++der + _parse_length(&der)) > end)
			return 0;

		INTEGER
		{
			// r
			der++;
			size_t length = _parse_length(&der);

			if ((der + length) > end)
				return 0;

			if (mp_read_unsigned_bin(r, der, length) != MP_OKAY)
				return 0;

			der += length;
		}

		INTEGER
		{
			// s
			der++;
			size_t length = _parse_length(&der);

			if ((der + length) > end)
				return 0;

			return (mp_read_unsigned_bin(s, der, length) == MP_OKAY);
		}
	}

	return 0;
}